

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dayperiodrules.cpp
# Opt level: O3

int32_t __thiscall
icu_63::DayPeriodRules::getEndHourForDayPeriod
          (DayPeriodRules *this,DayPeriod dayPeriod,UErrorCode *errorCode)

{
  int iVar1;
  long lVar2;
  
  if (U_ZERO_ERROR < *errorCode) {
    return -1;
  }
  if (dayPeriod != DAYPERIOD_MIDNIGHT) {
    if (dayPeriod == DAYPERIOD_NOON) {
      return 0xc;
    }
    if ((this->fDayPeriodForHour[0] == dayPeriod) && (this->fDayPeriodForHour[0x17] == dayPeriod)) {
      lVar2 = 2;
      do {
        if (this->fDayPeriodForHour[lVar2 + -1] != dayPeriod) {
          return (int)lVar2 + -1;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0x18);
    }
    else {
      iVar1 = 0x18;
      do {
        if (this->fDayPeriodForHour[iVar1 - 1] == dayPeriod) {
          return iVar1;
        }
        iVar1 = iVar1 + -1;
      } while (iVar1 != 0);
    }
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return -1;
  }
  return 0;
}

Assistant:

int32_t DayPeriodRules::getEndHourForDayPeriod(
        DayPeriodRules::DayPeriod dayPeriod, UErrorCode &errorCode) const {
    if (U_FAILURE(errorCode)) { return -1; }

    if (dayPeriod == DAYPERIOD_MIDNIGHT) { return 0; }
    if (dayPeriod == DAYPERIOD_NOON) { return 12; }

    if (fDayPeriodForHour[0] == dayPeriod && fDayPeriodForHour[23] == dayPeriod) {
        // dayPeriod wraps around midnight. End hour is before start hour.
        for (int32_t i = 1; i <= 22; ++i) {
            if (fDayPeriodForHour[i] != dayPeriod) {
                // i o'clock is when a new period starts, therefore when the old period ends.
                return i;
            }
        }
    } else {
        for (int32_t i = 23; i >= 0; --i) {
            if (fDayPeriodForHour[i] == dayPeriod) {
                return (i + 1);
            }
        }
    }

    // dayPeriod doesn't exist in rule set; set error and exit.
    errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return -1;
}